

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O2

bool __thiscall QLCDNumber::checkOverflow(QLCDNumber *this,int num)

{
  long lVar1;
  long in_FS_OFFSET;
  bool of;
  QArrayDataPointer<char16_t> QStack_38;
  bool local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
  local_19 = true;
  int2string((QString *)&QStack_38,num,*(byte *)(lVar1 + 0x288) & 3,*(int *)(lVar1 + 0x278),
             &local_19);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool QLCDNumber::checkOverflow(int num) const
{
    Q_D(const QLCDNumber);
    bool of;
    int2string(num, d->base, d->ndigits, &of);
    return of;
}